

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg,char *seq,int start,int end)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  uint unaff_R12D;
  uint uVar11;
  uint uVar12;
  
  puVar3 = (uint *)reg->seq_hash;
  bVar5 = true;
  if (puVar3 != (uint *)0x0) {
    uVar1 = *puVar3;
    if (uVar1 == 0) {
      uVar7 = 0;
    }
    else {
      uVar11 = (uint)*seq;
      if (*seq == '\0') {
        uVar11 = 0;
      }
      else {
        cVar6 = seq[1];
        if (cVar6 != '\0') {
          pcVar9 = seq + 2;
          do {
            uVar11 = (int)cVar6 + uVar11 * 0x1f;
            cVar6 = *pcVar9;
            pcVar9 = pcVar9 + 1;
          } while (cVar6 != '\0');
        }
      }
      uVar11 = uVar11 & uVar1 - 1;
      lVar4 = *(long *)(puVar3 + 4);
      iVar10 = 1;
      uVar12 = uVar11;
      do {
        uVar2 = *(uint *)(lVar4 + (ulong)(uVar12 >> 4) * 4);
        unaff_R12D = uVar12 * 2 & 0x1e;
        uVar7 = uVar2 >> (sbyte)unaff_R12D;
        if (((uVar7 & 2) != 0) ||
           (((uVar7 & 1) == 0 &&
            (iVar8 = strcmp(*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar12 * 8),seq), iVar8 == 0))
           )) {
          uVar7 = uVar12;
          if ((uVar2 >> (sbyte)unaff_R12D & 3) != 0) {
            uVar7 = uVar1;
          }
          break;
        }
        uVar12 = uVar12 + iVar10 & uVar1 - 1;
        iVar10 = iVar10 + 1;
        uVar7 = uVar1;
      } while (uVar12 != uVar11);
    }
    bVar5 = true;
    if (uVar7 != uVar1) {
      unaff_R12D = *(uint *)(*(long *)(puVar3 + 8) + (ulong)uVar7 * 4);
      bVar5 = false;
    }
  }
  if (bVar5) {
LAB_00115785:
    iVar10 = -1;
  }
  else {
    uVar1 = reg->prev_seq;
    if (((uVar1 == 0xffffffff) || (unaff_R12D != uVar1)) || (start < reg->prev_start)) {
      if (((uVar1 != 0xffffffff) &&
          (reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0)) &&
         (reg->iseq != -1)) {
        bcf_sr_regions_flush(reg);
      }
      bcf_sr_regions_seek(reg,seq);
      reg->start = -1;
      reg->end = -1;
    }
    if ((reg->prev_seq != unaff_R12D) || (iVar10 = -2, reg->iseq == unaff_R12D)) {
      uVar1 = reg->iseq;
      reg->prev_seq = uVar1;
      reg->prev_start = start;
      while ((unaff_R12D == uVar1 && (reg->end < start))) {
        iVar10 = bcf_sr_regions_next(reg);
        if (iVar10 < 0) {
          return -2;
        }
        if (reg->iseq != unaff_R12D) goto LAB_00115785;
        if ((reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0) &&
           (reg->end < start)) {
          (*reg->missed_reg_handler)(reg,reg->missed_reg_data);
        }
        uVar1 = reg->iseq;
      }
      iVar10 = -(uint)(end < reg->start);
    }
  }
  return iVar10;
}

Assistant:

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg, const char *seq, int start, int end)
{
    int iseq;
    if ( khash_str2int_get(reg->seq_hash, seq, &iseq)<0 ) return -1;    // no such sequence

    if ( reg->prev_seq==-1 || iseq!=reg->prev_seq || reg->prev_start > start ) // new chromosome or after a seek
    {
        // flush regions left on previous chromosome
        if ( reg->missed_reg_handler && reg->prev_seq!=-1 && reg->iseq!=-1 )
            bcf_sr_regions_flush(reg);

        bcf_sr_regions_seek(reg, seq);
        reg->start = reg->end = -1;
    }
    if ( reg->prev_seq==iseq && reg->iseq!=iseq ) return -2;    // no more regions on this chromosome
    reg->prev_seq = reg->iseq;
    reg->prev_start = start;

    while ( iseq==reg->iseq && reg->end < start )
    {
        if ( bcf_sr_regions_next(reg) < 0 ) return -2;  // no more regions left
        if ( reg->iseq != iseq ) return -1; // does not overlap any regions
        if ( reg->missed_reg_handler && reg->end < start ) reg->missed_reg_handler(reg, reg->missed_reg_data);
    }
    if ( reg->start <= end ) return 0;    // region overlap
    return -1;  // no overlap
}